

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item_Array.cxx
# Opt level: O0

int __thiscall Fl_Tree_Item_Array::move(Fl_Tree_Item_Array *this,int to,int from)

{
  Fl_Tree_Item *pFVar1;
  bool bVar2;
  int local_34;
  int local_30;
  int r;
  int t_1;
  int t;
  Fl_Tree_Item *item;
  int from_local;
  int to_local;
  Fl_Tree_Item_Array *this_local;
  
  if (from == to) {
    this_local._4_4_ = 0;
  }
  else if ((((to < 0) || (this->_total <= to)) || (from < 0)) || (this->_total <= from)) {
    this_local._4_4_ = -1;
  }
  else {
    pFVar1 = this->_items[from];
    local_30 = from;
    r = from;
    if (from < to) {
      while( true ) {
        bVar2 = false;
        if (r < to) {
          bVar2 = r < this->_total + 1;
        }
        if (!bVar2) break;
        this->_items[r] = this->_items[r + 1];
        r = r + 1;
      }
    }
    else {
      for (; to < local_30 && 0 < local_30; local_30 = local_30 + -1) {
        this->_items[local_30] = this->_items[local_30 + -1];
      }
    }
    this->_items[to] = pFVar1;
    for (local_34 = 0; local_34 < this->_total; local_34 = local_34 + 1) {
      Fl_Tree_Item::update_prev_next(this->_items[local_34],local_34);
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Tree_Item_Array::move(int to, int from) {
  if ( from == to ) return 0;    // nop
  if ( to<0 || to>=_total || from<0 || from>=_total ) return -1;
  Fl_Tree_Item *item = _items[from];
  // Remove item..
  if ( from < to )
    for ( int t=from; t<to && t<(_total+1); t++ )
      _items[t] = _items[t+1];
  else
    for ( int t=from; t>to && t>0; t-- )
      _items[t] = _items[t-1];
  // Move to new position
  _items[to] = item;
  // Update all children
  for ( int r=0; r<_total; r++ )	// XXX: excessive to do all children,
    _items[r]->update_prev_next(r);	// XXX: but avoids weird boundary issues
  return 0;
}